

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inter_basics.cpp
# Opt level: O0

bool Am_Inter_Call_Both_Method
               (Am_Object *inter,Am_Object *command_obj,Am_Slot_Key method_slot,int x,int y,
               Am_Object *ref_obj,Am_Input_Char *ic,Am_Object *object_modified,
               Am_Inter_Location *points)

{
  bool bVar1;
  int iVar2;
  Am_Value *pAVar3;
  undefined1 local_48 [8];
  Am_Value state;
  Am_Object *ref_obj_local;
  int y_local;
  int x_local;
  Am_Slot_Key method_slot_local;
  Am_Object *command_obj_local;
  Am_Object *inter_local;
  
  state.value = (anon_union_8_8_ea4c8939_for_value)ref_obj;
  Am_Inter_Call_Method(inter,method_slot,x,y,ref_obj,ic,object_modified,points);
  Am_Value::Am_Value((Am_Value *)local_48);
  bVar1 = Am_Object::Valid(inter);
  if (bVar1) {
    pAVar3 = Am_Object::Peek(inter,0x123,0);
    Am_Value::operator=((Am_Value *)local_48,pAVar3);
    bVar1 = Am_Value::Exists((Am_Value *)local_48);
    if ((bVar1) &&
       ((iVar2 = Am_Value::operator_cast_to_int((Am_Value *)local_48), iVar2 != 3 ||
        (method_slot == 0xc9)))) {
      Am_Inter_Call_Method
                (command_obj,method_slot,x,y,(Am_Object *)state.value.wrapper_value,ic,
                 object_modified,points);
      bVar1 = Am_Object::Valid(inter);
      if (bVar1) {
        pAVar3 = Am_Object::Peek(inter,0x123,0);
        Am_Value::operator=((Am_Value *)local_48,pAVar3);
        bVar1 = Am_Value::Exists((Am_Value *)local_48);
        if ((bVar1) && (iVar2 = Am_Value::operator_cast_to_int((Am_Value *)local_48), iVar2 != 3)) {
          inter_local._7_1_ = true;
        }
        else {
          inter_local._7_1_ = false;
        }
      }
      else {
        inter_local._7_1_ = false;
      }
    }
    else {
      inter_local._7_1_ = false;
    }
  }
  else {
    inter_local._7_1_ = false;
  }
  Am_Value::~Am_Value((Am_Value *)local_48);
  return inter_local._7_1_;
}

Assistant:

bool
Am_Inter_Call_Both_Method(Am_Object &inter, Am_Object &command_obj,
                          Am_Slot_Key method_slot, int x, int y,
                          Am_Object &ref_obj, Am_Input_Char &ic,
                          Am_Object &object_modified, Am_Inter_Location &points)
{
  Am_Inter_Call_Method(inter, method_slot, x, y, ref_obj, ic, object_modified,
                       points);
  Am_Value state;
  //method might destroy interactor, so be cautious
  if (!inter.Valid())
    return false;
  state = inter.Peek(Am_CURRENT_STATE);
  //see if that method destroyed the interactor or aborted it when not
  //doing the abort method
  if (!state.Exists() ||
      ((int)state == Am_INTER_ABORTING && method_slot != Am_ABORT_DO_METHOD))
    return false;
  // otherwise, continue

  Am_Inter_Call_Method(command_obj, method_slot, x, y, ref_obj, ic,
                       object_modified, points);
  //method might destroy interactor, so be cautious
  if (!inter.Valid())
    return false;

  state = inter.Peek(Am_CURRENT_STATE);
  if (!state.Exists() || (int)state == Am_INTER_ABORTING)
    return false;
  else
    return true;
}